

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

void SSL_get0_alpn_selected(SSL *ssl,uint8_t **out_data,uint *out_len)

{
  SSL3_STATE *pSVar1;
  SSL_HANDSHAKE *pSVar2;
  ulong uVar3;
  __uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true> _Var4;
  size_t *psVar5;
  Array<unsigned_char> *pAVar6;
  
  pSVar1 = ssl->s3;
  pSVar2 = (pSVar1->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
  if (((pSVar2 == (SSL_HANDSHAKE *)0x0) || ((pSVar2->field_0x6c9 & 4) == 0)) ||
     ((ssl->field_0xa4 & 1) != 0)) {
    pAVar6 = &pSVar1->alpn_selected;
    psVar5 = &(pSVar1->alpn_selected).size_;
  }
  else {
    _Var4.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (pSVar2->early_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
    ;
    pAVar6 = (Array<unsigned_char> *)
             ((long)_Var4.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x188);
    psVar5 = (size_t *)
             ((long)_Var4.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 400);
  }
  uVar3 = *psVar5;
  if (uVar3 < 0xffffffff) {
    *out_data = pAVar6->data_;
    *out_len = (uint)uVar3;
    return;
  }
  __assert_fail("protocol.size() < UINT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0x8ca,"void SSL_get0_alpn_selected(const SSL *, const uint8_t **, unsigned int *)")
  ;
}

Assistant:

void SSL_get0_alpn_selected(const SSL *ssl, const uint8_t **out_data,
                            unsigned *out_len) {
  Span<const uint8_t> protocol;
  if (SSL_in_early_data(ssl) && !ssl->server) {
    protocol = ssl->s3->hs->early_session->early_alpn;
  } else {
    protocol = ssl->s3->alpn_selected;
  }
  // ALPN protocols have one-byte lengths, so they must fit in |unsigned|.
  assert(protocol.size() < UINT_MAX);
  *out_data = protocol.data();
  *out_len = static_cast<unsigned>(protocol.size());
}